

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O0

void __thiscall
adios2sys::Encoding::CommandLineArguments::CommandLineArguments
          (CommandLineArguments *this,int ac,char **av)

{
  char *pcVar1;
  reference ppcVar2;
  long in_RDX;
  int in_ESI;
  vector<char_*,_std::allocator<char_*>_> *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffdc;
  vector<char_*,_std::allocator<char_*>_> *in_stack_ffffffffffffffe0;
  
  std::vector<char_*,_std::allocator<char_*>_>::vector
            ((vector<char_*,_std::allocator<char_*>_> *)0xf2f739);
  std::vector<char_*,_std::allocator<char_*>_>::resize
            (in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
            );
  for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
    pcVar1 = strdup(*(char **)(in_RDX + (long)iVar3 * 8));
    ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](in_RDI,(long)iVar3);
    *ppcVar2 = pcVar1;
  }
  ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](in_RDI,(long)in_ESI);
  *ppcVar2 = (value_type)0x0;
  return;
}

Assistant:

Encoding::CommandLineArguments::CommandLineArguments(int ac,
                                                     char const* const* av)
{
  this->argv_.resize(ac + 1);
  for (int i = 0; i < ac; i++) {
    this->argv_[i] = strdup(av[i]);
  }
  this->argv_[ac] = nullptr;
}